

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

int __thiscall AActor::GetModifiedDamage(AActor *this,FName *damagetype,int damage,bool passive)

{
  AInventory *pAVar1;
  undefined8 local_8;
  
  local_8 = (ulong)(uint)damage;
  pAVar1 = (this->Inventory).field_0.p;
  if (pAVar1 != (AInventory *)0x0) {
    if (((pAVar1->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
      pAVar1 = (this->Inventory).field_0.p;
      local_8 = CONCAT44(damagetype->Index,damage);
      (*(pAVar1->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x2c])
                (pAVar1,(ulong)(uint)damage,(long)&local_8 + 4,&local_8,(ulong)passive);
    }
    else {
      (this->Inventory).field_0.p = (AInventory *)0x0;
    }
  }
  return (int)local_8;
}

Assistant:

int AActor::GetModifiedDamage(FName damagetype, int damage, bool passive)
{
	if (Inventory != nullptr)
		Inventory->ModifyDamage(damage, damagetype, damage, passive);

	return damage;
}